

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float64_lt_quiet_mipsel(float64 a,float64 b,float_status *status)

{
  flag fVar1;
  flag fVar2;
  int iVar3;
  float64 a_00;
  float64 a_01;
  uint64_t uVar4;
  bool local_42;
  bool local_41;
  uint64_t bv;
  uint64_t av;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  
  a_00 = float64_squash_input_denormal_mipsel(a,status);
  a_01 = float64_squash_input_denormal_mipsel(b,status);
  iVar3 = extractFloat64Exp(a_00);
  if (((iVar3 == 0x7ff) && (uVar4 = extractFloat64Frac(a_00), uVar4 != 0)) ||
     ((iVar3 = extractFloat64Exp(a_01), iVar3 == 0x7ff &&
      (uVar4 = extractFloat64Frac(a_01), uVar4 != 0)))) {
    iVar3 = float64_is_signaling_nan_mipsel(a_00,status);
    if ((iVar3 != 0) || (iVar3 = float64_is_signaling_nan_mipsel(a_01,status), iVar3 != 0)) {
      float_raise_mipsel('\x01',status);
    }
    a_local._4_4_ = 0;
  }
  else {
    fVar1 = extractFloat64Sign(a_00);
    fVar2 = extractFloat64Sign(a_01);
    if (fVar1 == fVar2) {
      local_42 = a_00 != a_01 && (bool)fVar1 != a_00 < a_01;
      a_local._4_4_ = (uint)local_42;
    }
    else {
      local_41 = fVar1 != '\0' && ((a_00 | a_01) & 0x7fffffffffffffff) != 0;
      a_local._4_4_ = (uint)local_41;
    }
  }
  return a_local._4_4_;
}

Assistant:

int float64_lt_quiet(float64 a, float64 b, float_status *status)
{
    flag aSign, bSign;
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat64Sign( a );
    bSign = extractFloat64Sign( b );
    av = float64_val(a);
    bv = float64_val(b);
    if ( aSign != bSign ) return aSign && ( (uint64_t) ( ( av | bv )<<1 ) != 0 );
    return ( av != bv ) && ( aSign ^ ( av < bv ) );

}